

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_utils_leb128.c
# Opt level: O2

size_t lj_utils_write_leb128(uint8_t *buffer,int64_t value)

{
  size_t sVar1;
  
  sVar1 = 1;
  for (; value - 0x40U < 0xffffffffffffff80; value = value >> 7) {
    buffer[sVar1 - 1] = (byte)value | 0x80;
    sVar1 = sVar1 + 1;
  }
  buffer[sVar1 - 1] = (byte)value & 0x7f;
  return sVar1;
}

Assistant:

size_t LJ_FASTCALL lj_utils_write_leb128(uint8_t *buffer, int64_t value)
{
  size_t i = 0;

  /* LEB_SIGN_BIT propagation to check the remaining value. */
  while ((uint64_t)(value + LEB_SIGN_BIT) >= MIN_TWOBYTE_VALUE) {
    buffer[i++] = (uint8_t)((value & PAYLOAD_MASK) | LINK_BIT);
    value >>= SHIFT_STEP;
  }

  /* Omit LINK_BIT in case of overflow. */
  buffer[i++] = (uint8_t)(value & PAYLOAD_MASK);

  lj_assertX(i <= LEB128_U64_MAXSIZE, "bad leb128 size");

  return i;
}